

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QGraphicsPixmapItem * __thiscall QGraphicsPixmapItem::shape(QGraphicsPixmapItem *this)

{
  QGraphicsPixmapItemPrivate *this_00;
  long in_RSI;
  QGraphicsPixmapItemPrivate *thatD;
  
  this_00 = *(QGraphicsPixmapItemPrivate **)(in_RSI + 8);
  if (this_00->hasShape == false) {
    QGraphicsPixmapItemPrivate::updateShape(this_00);
    this_00->hasShape = true;
  }
  QPainterPath::QPainterPath((QPainterPath *)this,(QPainterPath *)(*(long *)(in_RSI + 8) + 0x1b0));
  return this;
}

Assistant:

QPainterPath QGraphicsPixmapItem::shape() const
{
    Q_D(const QGraphicsPixmapItem);
    if (!d->hasShape) {
        QGraphicsPixmapItemPrivate *thatD = const_cast<QGraphicsPixmapItemPrivate *>(d);
        thatD->updateShape();
        thatD->hasShape = true;
    }
    return d_func()->shape;
}